

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void set_get_max_keylen(void)

{
  fdb_status fVar1;
  int i;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  size_t rvalue_len;
  void *rvalue;
  char keybuf [65408];
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle **in_stack_fffffffffffefec8;
  fdb_file_handle *in_stack_fffffffffffefed0;
  undefined4 in_stack_fffffffffffefee8;
  int iVar2;
  undefined2 uVar3;
  undefined6 in_stack_fffffffffffefef2;
  size_t in_stack_fffffffffffefef8;
  void *in_stack_fffffffffffeff00;
  fdb_kvs_handle *in_stack_fffffffffffeff08;
  fdb_kvs_handle *local_10000;
  char local_ffd8 [192];
  fdb_config *in_stack_ffffffffffff00e8;
  char *in_stack_ffffffffffff00f0;
  fdb_file_handle **in_stack_ffffffffffff00f8;
  undefined1 local_59;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  uVar3 = 0x10;
  system("rm -rf  dummy* > errorlog.txt");
  for (iVar2 = 0; iVar2 < 0xff80; iVar2 = iVar2 + 1) {
    local_ffd8[iVar2] = *set_get_max_keylen::achar;
  }
  local_59 = 0;
  fVar1 = fdb_open(in_stack_ffffffffffff00f8,in_stack_ffffffffffff00f0,in_stack_ffffffffffff00e8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x15e);
    set_get_max_keylen::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x15e,"void set_get_max_keylen()");
    }
  }
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffefed0,in_stack_fffffffffffefec8,(fdb_kvs_config *)0x1072dc)
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x160);
    set_get_max_keylen::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x160,"void set_get_max_keylen()");
    }
  }
  strlen(local_ffd8);
  fVar1 = fdb_set_kv(in_stack_fffffffffffeff08,in_stack_fffffffffffeff00,in_stack_fffffffffffefef8,
                     (void *)CONCAT62(in_stack_fffffffffffefef2,uVar3),
                     CONCAT44(iVar2,in_stack_fffffffffffefee8));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x164);
    set_get_max_keylen::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x164,"void set_get_max_keylen()");
    }
  }
  fVar1 = fdb_get(local_10000,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_ARGS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x168);
    set_get_max_keylen::__test_pass = 0;
    if (fVar1 != FDB_RESULT_INVALID_ARGS) {
      __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x168,"void set_get_max_keylen()");
    }
  }
  strlen(local_ffd8);
  fVar1 = fdb_get_kv(in_stack_fffffffffffeff08,in_stack_fffffffffffeff00,in_stack_fffffffffffefef8,
                     (void **)CONCAT62(in_stack_fffffffffffefef2,uVar3),
                     (size_t *)CONCAT44(iVar2,in_stack_fffffffffffefee8));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x16c);
    set_get_max_keylen::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x16c,"void set_get_max_keylen()");
    }
  }
  fdb_close((fdb_file_handle *)local_10000);
  fdb_shutdown();
  memleak_end();
  if (set_get_max_keylen::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","set get max keylen");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","set get max keylen");
  }
  return;
}

Assistant:

void set_get_max_keylen()
{
    TEST_INIT();
    memleak_start();

    int r;
    static const int len = FDB_MAX_KEYLEN;
    char keybuf[len];
    void *rvalue;
    size_t rvalue_len;
    static const char *achar = "a";

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.chunksize = 16;


    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    for (int i = 0; i < len; ++i) {
        keybuf[i] = *achar;
    }
    keybuf[len-1] = '\0';

    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set kv
    status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get NULL pointer
    status = fdb_get(db, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // get kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get max keylen");
}